

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O0

TPZFMatrix<float> * __thiscall
TPZFMatrix<float>::operator=(TPZFMatrix<float> *this,TPZFMatrix<float> *A)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  TPZFMatrix<float> *in_RSI;
  TPZFMatrix<float> *in_RDI;
  float *newElem;
  int64_t size;
  char *in_stack_00000188;
  char *in_stack_00000190;
  TPZMatrix<float> *in_stack_ffffffffffffffc8;
  float *local_28;
  TPZFMatrix<float> *local_8;
  
  local_8 = in_RDI;
  if (in_RDI != in_RSI) {
    uVar3 = (in_RSI->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow *
            (in_RSI->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol;
    local_28 = in_RDI->fElem;
    if ((in_RDI->fSize < (long)uVar3) &&
       (uVar3 != (in_RDI->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow *
                 (in_RDI->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol)) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar3;
      uVar2 = SUB168(auVar1 * ZEXT816(4),0);
      if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
        uVar2 = 0xffffffffffffffff;
      }
      local_28 = (float *)operator_new__(uVar2);
    }
    else if ((long)uVar3 <= in_RDI->fSize) {
      local_28 = in_RDI->fGiven;
    }
    if ((local_28 == (float *)0x0) && (0 < (long)uVar3)) {
      Error(in_stack_00000190,in_stack_00000188);
    }
    if ((((in_RDI->fElem != (float *)0x0) && (in_RDI->fElem != local_28)) &&
        (in_RDI->fElem != in_RDI->fGiven)) &&
       (in_stack_ffffffffffffffc8 = (TPZMatrix<float> *)in_RDI->fElem,
       in_stack_ffffffffffffffc8 != (TPZMatrix<float> *)0x0)) {
      operator_delete__(in_stack_ffffffffffffffc8);
    }
    (in_RDI->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow =
         (in_RSI->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow;
    (in_RDI->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol =
         (in_RSI->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol;
    in_RDI->fElem = local_28;
    memcpy(in_RDI->fElem,in_RSI->fElem,uVar3 * 4);
    TPZMatrix<float>::operator=(&in_RDI->super_TPZMatrix<float>,in_stack_ffffffffffffffc8);
    local_8 = in_RDI;
  }
  return local_8;
}

Assistant:

TPZFMatrix<TVar> &TPZFMatrix<TVar>::operator=(const TPZFMatrix<TVar> &A ) {
    if(this == &A) return *this;
    int64_t size = A.fRow * A.fCol;
    
    TVar * newElem = fElem;
    if(fSize < size && size != this->fRow*this->fCol) {
        newElem = new TVar
        [size] ;
    } else if (fSize >= size) {
        newElem = fGiven;
    }
    
    if ( newElem == NULL && size > 0) Error( "Operator= <memory allocation error>." );
    if (fElem && fElem != newElem && fElem != fGiven) delete[]( fElem );
    this->fRow  = A.fRow;
    this->fCol  = A.fCol;
    fElem = newElem;
    
    // Copia a matriz
    memcpy((void *)(fElem),(void *)(A.fElem),(size_t)size*sizeof(TVar));
    
    TPZMatrix<TVar>::operator=(A);
    
    
    return *this;
}